

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v6::
         format_to<fmt::v6::basic_string_view<char>,std::__cxx11::string_const&,char_const*const&,250ul,char>
                   (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf,
                   basic_string_view<char> *format_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char **args_1)

{
  iterator iVar1;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  pointer local_28;
  size_type sStack_20;
  char *local_18;
  
  local_28 = (args->_M_dataplus)._M_p;
  sStack_20 = args->_M_string_length;
  local_18 = *args_1;
  args_00.field_1.values_ =
       (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        *)&local_28;
  args_00.types_ = 0x1ae;
  iVar1 = internal::vformat_to<char>(&buf->super_buffer<char>,*format_str,args_00);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::iterator format_to(
    basic_memory_buffer<Char, SIZE>& buf, const S& format_str, Args&&... args) {
  internal::check_format_string<Args...>(format_str);
  using context = buffer_context<Char>;
  return internal::vformat_to(buf, to_string_view(format_str),
                              {make_format_args<context>(args...)});
}